

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile_caf.c
# Opt level: O3

off_t caf_nextchunk(t_soundfile *sf,off_t offset,t_chunk_conflict *chunk)

{
  int iVar1;
  int64_t iVar2;
  ssize_t sVar3;
  off_t oVar4;
  long offset_00;
  
  iVar1 = sys_isbigendian();
  iVar2 = swap8s(*(int64_t *)chunk->c_size,(uint)(iVar1 == 0));
  offset_00 = (ulong)((int)iVar2 + (int)offset + 0xcU & 1) + offset + iVar2 + 0xc;
  sVar3 = fd_read(sf->sf_fd,offset_00,chunk,0xc);
  oVar4 = -1;
  if (0xb < sVar3) {
    oVar4 = offset_00;
  }
  return oVar4;
}

Assistant:

static off_t caf_nextchunk(const t_soundfile *sf, off_t offset, t_chunk *chunk)
{
    int64_t chunksize = caf_getchunksize(chunk, !sys_isbigendian());
    off_t seekto = offset + CAFCHUNKSIZE + chunksize;
    if (seekto & 1) /* pad up to even number of bytes */
        seekto++;
    if (fd_read(sf->sf_fd, seekto, (char *)chunk,
        CAFCHUNKSIZE) < CAFCHUNKSIZE)
        return -1;
    return seekto;
}